

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
* dgrminer::enumerate(set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                      *__return_storage_ptr__,
                     vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                     *adjacency_lists,vector<int,_std::allocator<int>_> *graph_ids,
                     vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     *pattern_edge_list,
                     vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     *nodes_occupied_by_antecedent,
                     vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     *edges_occupied_by_antecedent,bool new_measures,
                     unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                     *multiple_pattern_occurrences,
                     unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                     *multiple_antecedent_occurrences)

{
  allocator<int> *paVar1;
  int *this;
  pointer *this_00;
  int iVar2;
  int iVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  value_type vVar8;
  value_type vVar9;
  value_type vVar10;
  value_type vVar11;
  value_type vVar12;
  size_t sVar13;
  bool bVar14;
  value_type vVar15;
  size_type sVar16;
  reference pvVar17;
  reference pvVar18;
  ulong uVar19;
  reference piVar20;
  reference pvVar21;
  reference pvVar22;
  reference pvVar23;
  reference pvVar24;
  reference pvVar25;
  reference pvVar26;
  reference pvVar27;
  mapped_type *pmVar28;
  reference pvVar29;
  pointer pcVar30;
  bool bVar31;
  pair<std::_Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_bool>
  pVar32;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar33;
  pair<std::_Rb_tree_const_iterator<dgrminer::children_candidate>,_bool> pVar34;
  bool local_b11;
  bool local_ac1;
  bool local_7f9;
  array<int,_8UL> local_738;
  ulong local_718;
  size_t i_11;
  size_t k_1;
  bool is_already_there_1;
  ulong uStack_700;
  int dst_1;
  size_t edge_ind_1;
  undefined1 local_6f0 [3];
  bool should_backtrack_1;
  int src_1;
  ulong local_6d0;
  size_t i_10;
  size_t k;
  ulong uStack_6b8;
  bool is_already_there;
  size_t edge_ind;
  value_type local_6a8;
  value_type vStack_6a4;
  bool should_backtrack;
  int dst;
  int src;
  int j;
  int i_3;
  undefined1 local_690;
  _Base_ptr local_688;
  undefined1 local_680;
  _Base_ptr local_678;
  undefined1 local_670;
  _Base_ptr local_668;
  undefined1 local_660;
  _Base_ptr local_658;
  undefined1 local_650;
  _Self local_648;
  _Self local_640;
  iterator it_1;
  children_candidate cc_1;
  array<int,_10UL> e_cand_1;
  undefined1 local_558 [8];
  set<int,_std::less<int>,_std::allocator<int>_> child_occurrence_vertexes;
  undefined1 local_520 [4];
  int j_2;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> edge_candidates_1;
  vector<int,_std::allocator<int>_> real_second_edge_ids;
  int i_9;
  _Self local_498;
  _Self local_490;
  iterator it;
  children_candidate cc;
  array<int,_10UL> e_cand;
  int j_1;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> edge_candidates;
  ulong uStack_3a0;
  int i_8;
  size_t i_7;
  int backward_starting_ind;
  int right_most_vertex;
  size_t i_6;
  vector<int,_std::allocator<int>_> right_most_path_occurrence;
  value_type local_310;
  int local_30c;
  int n_1_1;
  int i_5;
  set<int,_std::less<int>,_std::allocator<int>_> antecedent_vertexes;
  set<int,_std::less<int>,_std::allocator<int>_> pattern_occurrence_vertexes;
  value_type local_270;
  int n_2;
  int n_1;
  int i_4;
  undefined1 local_260 [8];
  vector<int,_std::allocator<int>_> sequence_of_edge_indices;
  undefined1 local_240 [8];
  vector<int,_std::allocator<int>_> sequence_of_nodes;
  ulong local_208;
  size_t i_2;
  size_t v;
  size_t u;
  allocator<int> local_1e5;
  int index_in_pattern_edge_list;
  undefined1 local_1e0 [8];
  vector<int,_std::allocator<int>_> real_ids_src_ind;
  undefined1 local_1c0 [8];
  vector<int,_std::allocator<int>_> real_ids_dst_ind;
  undefined1 local_1a0 [8];
  vector<int,_std::allocator<int>_> real_ids_dst;
  undefined1 local_180 [8];
  vector<int,_std::allocator<int>_> real_ids_src;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adj_edge_info;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adj_list;
  iterator iStack_130;
  int g_id;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  _Rb_tree_node_base _Stack_110;
  size_t sStack_f0;
  set<int,_std::less<int>,_std::allocator<int>_> local_e8;
  int local_ac;
  ulong uStack_a8;
  int i_1;
  size_t i;
  int number_of_nodes_in_pattern_edge_list;
  undefined1 local_90 [8];
  deque<int,_std::allocator<int>_> right_most_path;
  bool new_measures_local;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *edges_occupied_by_antecedent_local;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *nodes_occupied_by_antecedent_local;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *pattern_edge_list_local;
  vector<int,_std::allocator<int>_> *graph_ids_local;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  *adjacency_lists_local;
  set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
  *children_candidates;
  
  right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node._7_1_ = new_measures;
  right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node._6_1_ = 0;
  std::
  set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
  ::set(__return_storage_ptr__);
  find_rightmost_path((deque<int,_std::allocator<int>_> *)local_90,pattern_edge_list);
  i._0_4_ = 0;
  for (uStack_a8 = 0; uVar19 = uStack_a8,
      sVar16 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                         (pattern_edge_list), iVar2 = (value_type)i, uVar19 < sVar16;
      uStack_a8 = uStack_a8 + 1) {
    pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](pattern_edge_list,uStack_a8);
    pvVar18 = std::array<int,_10UL>::operator[](pvVar17,1);
    if (iVar2 < *pvVar18) {
      pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                operator[](pattern_edge_list,uStack_a8);
      pvVar18 = std::array<int,_10UL>::operator[](pvVar17,1);
      i._0_4_ = *pvVar18;
    }
  }
  i._0_4_ = (value_type)i + 1;
  for (local_ac = 0; uVar19 = (ulong)local_ac,
      sVar16 = std::
               vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
               size(adjacency_lists), uVar19 < sVar16; local_ac = local_ac + 1) {
    local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_e8._M_t._M_impl._0_8_ = 0;
    local_e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_e8);
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::push_back(nodes_occupied_by_antecedent,&local_e8);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_e8);
    _Stack_110._M_right = (_Base_ptr)0x0;
    sStack_f0 = 0;
    _Stack_110._M_parent = (_Base_ptr)0x0;
    _Stack_110._M_left = (_Base_ptr)0x0;
    __range1 = (vector<int,_std::allocator<int>_> *)0x0;
    _Stack_110._M_color = _S_red;
    _Stack_110._4_4_ = 0;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::push_back(edges_occupied_by_antecedent,
                (set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  }
  __end1 = std::vector<int,_std::allocator<int>_>::begin(graph_ids);
  iStack_130 = std::vector<int,_std::allocator<int>_>::end(graph_ids);
  do {
    bVar14 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffed0);
    if (!bVar14) {
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node._6_1_ = 1;
      std::deque<int,_std::allocator<int>_>::~deque((deque<int,_std::allocator<int>_> *)local_90);
      if ((right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_node._6_1_ & 1) == 0) {
        std::
        set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
        ::~set(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    piVar20 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&__end1);
    adj_list.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = *piVar20;
    pvVar21 = std::
              vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
              operator[](adjacency_lists,
                         (long)adj_list.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)&adj_edge_info.
                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&pvVar21->adjacencyList);
    pvVar21 = std::
              vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
              operator[](adjacency_lists,
                         (long)adj_list.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::
    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ::vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
              *)&real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,&pvVar21->adjacencyEdgeInfo);
    sVar16 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                       (pattern_edge_list);
    real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    paVar1 = (allocator<int> *)
             ((long)&real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_180,sVar16,
               (value_type *)
               ((long)&real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    sVar16 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                       (pattern_edge_list);
    real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    paVar1 = (allocator<int> *)
             ((long)&real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1a0,sVar16,
               (value_type *)
               ((long)&real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    sVar16 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                       (pattern_edge_list);
    real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    paVar1 = (allocator<int> *)
             ((long)&real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1c0,sVar16,
               (value_type *)
               ((long)&real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    sVar16 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                       (pattern_edge_list);
    index_in_pattern_edge_list = 0;
    std::allocator<int>::allocator(&local_1e5);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1e0,sVar16,&index_in_pattern_edge_list,
               &local_1e5);
    std::allocator<int>::~allocator(&local_1e5);
    u._4_4_ = 0;
    for (v = 0; sVar16 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&adj_edge_info.
                                    super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage), v < sVar16;
        v = v + 1) {
      i_2 = 0;
      while( true ) {
        pvVar22 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)&adj_edge_info.
                                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,v);
        sVar16 = std::vector<int,_std::allocator<int>_>::size(pvVar22);
        if (sVar16 <= i_2) break;
        pvVar23 = std::
                  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                  ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                *)&real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,v);
        pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                  operator[](pvVar23,i_2);
        pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                  operator[](pattern_edge_list,(long)u._4_4_);
        bVar14 = is_adj_info_equal_to_pattern_edge(pvVar24,pvVar17,true);
        if (bVar14) {
          pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_180,0);
          *pvVar25 = (value_type)v;
          pvVar22 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)&adj_edge_info.
                                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,v);
          pvVar25 = std::vector<int,_std::allocator<int>_>::operator[](pvVar22,i_2);
          vVar15 = *pvVar25;
          pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_1a0,0);
          *pvVar25 = vVar15;
          pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_1c0,0);
          *pvVar25 = (value_type)i_2;
          local_208 = 0;
          while( true ) {
            pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_1a0,0);
            pvVar22 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    *)&adj_edge_info.
                                       super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)*pvVar25);
            sVar16 = std::vector<int,_std::allocator<int>_>::size(pvVar22);
            if (sVar16 <= local_208) break;
            pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_1a0,0);
            pvVar22 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    *)&adj_edge_info.
                                       super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)*pvVar25);
            pvVar25 = std::vector<int,_std::allocator<int>_>::operator[](pvVar22,local_208);
            local_7f9 = false;
            if ((long)*pvVar25 == v) {
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1a0,0);
              pvVar23 = std::
                        vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                        ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                      *)&real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)*pvVar25);
              pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                        operator[](pvVar23,local_208);
              flipAdjacencyInfo((array<int,_8UL> *)
                                &sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar24);
              pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ::operator[](pattern_edge_list,(long)u._4_4_);
              local_7f9 = is_adj_info_equal_to_pattern_edge
                                    ((array<int,_8UL> *)
                                     &sequence_of_nodes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage,pvVar17,true);
            }
            if (local_7f9 != false) {
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1e0,0);
              *pvVar25 = (value_type)local_208;
              break;
            }
            local_208 = local_208 + 1;
          }
          sVar16 = (size_type)(value_type)i;
          sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          paVar1 = (allocator<int> *)
                   ((long)&sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
          std::allocator<int>::allocator(paVar1);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_240,sVar16,
                     (value_type *)
                     ((long)&sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
          std::allocator<int>::~allocator
                    ((allocator<int> *)
                     ((long)&sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
          pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_240,0);
          *pvVar25 = (value_type)v;
          pvVar22 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)&adj_edge_info.
                                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,v);
          pvVar25 = std::vector<int,_std::allocator<int>_>::operator[](pvVar22,i_2);
          vVar15 = *pvVar25;
          pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_240,1);
          *pvVar25 = vVar15;
          sVar16 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                             (pattern_edge_list);
          i_4 = 0;
          std::allocator<int>::allocator((allocator<int> *)((long)&n_1 + 3));
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_260,sVar16,&i_4,
                     (allocator<int> *)((long)&n_1 + 3));
          std::allocator<int>::~allocator((allocator<int> *)((long)&n_1 + 3));
          pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_260,(long)u._4_4_);
          *pvVar25 = (value_type)i_2;
          u._4_4_ = u._4_4_ + 1;
LAB_00187f22:
          sVar16 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                             (pattern_edge_list);
          if (sVar16 <= (ulong)(long)u._4_4_) {
            for (n_2 = 0; uVar19 = (ulong)n_2,
                sVar16 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         ::size(pattern_edge_list), uVar19 < sVar16; n_2 = n_2 + 1) {
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_180,(long)n_2);
              local_270 = *pvVar25;
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1c0,(long)n_2);
              iVar2 = *pvVar25;
              pvVar26 = std::
                        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                        ::operator[](nodes_occupied_by_antecedent,
                                     (long)adj_list.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
              ;
              std::set<int,_std::less<int>,_std::allocator<int>_>::insert(pvVar26,&local_270);
              pvVar26 = std::
                        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                        ::operator[](nodes_occupied_by_antecedent,
                                     (long)adj_list.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
              ;
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1a0,(long)n_2);
              std::set<int,_std::less<int>,_std::allocator<int>_>::insert(pvVar26,pvVar25);
              pvVar26 = std::
                        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                        ::operator[](edges_occupied_by_antecedent,
                                     (long)adj_list.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
              ;
              pvVar23 = std::
                        vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                        ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                      *)&real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)local_270);
              pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
                        operator[](pvVar23,(long)iVar2);
              pvVar27 = std::array<int,_8UL>::operator[](pvVar24,7);
              std::set<int,_std::less<int>,_std::allocator<int>_>::insert(pvVar26,pvVar27);
            }
            std::set<int,_std::less<int>,_std::allocator<int>_>::set
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       &antecedent_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count);
            if ((right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) {
              std::set<int,_std::less<int>,_std::allocator<int>_>::set
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&n_1_1);
              for (local_30c = 0; uVar19 = (ulong)local_30c,
                  sVar16 = std::
                           vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                           size(pattern_edge_list), uVar19 < sVar16; local_30c = local_30c + 1) {
                pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_180,(long)local_30c)
                ;
                local_310 = *pvVar25;
                std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           &antecedent_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_310);
                pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_1a0,(long)local_30c)
                ;
                std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           &antecedent_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           pvVar25);
                pvVar17 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](pattern_edge_list,(long)local_30c);
                pvVar18 = std::array<int,_10UL>::operator[](pvVar17,3);
                if (*pvVar18 != 0) {
                  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)&n_1_1,&local_310);
                }
                pvVar17 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](pattern_edge_list,(long)local_30c);
                pvVar18 = std::array<int,_10UL>::operator[](pvVar17,8);
                if (*pvVar18 != 0) {
                  pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)local_1a0,
                                       (long)local_30c);
                  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)&n_1_1,pvVar25);
                }
              }
              pmVar28 = std::
                        unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                        ::operator[](multiple_pattern_occurrences,
                                     (key_type *)
                                     ((long)&adj_list.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                    );
              std::
              set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::insert(pmVar28,(value_type *)
                               &antecedent_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count
                      );
              pmVar28 = std::
                        unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                        ::operator[](multiple_antecedent_occurrences,
                                     (key_type *)
                                     ((long)&adj_list.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                    );
              pVar32 = std::
                       set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ::insert(pmVar28,(value_type *)&n_1_1);
              right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)pVar32.first._M_node;
              std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&n_1_1);
            }
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&i_6);
            for (_backward_starting_ind = 0;
                sVar16 = std::deque<int,_std::allocator<int>_>::size
                                   ((deque<int,_std::allocator<int>_> *)local_90),
                _backward_starting_ind < sVar16; _backward_starting_ind = _backward_starting_ind + 1
                ) {
              pvVar29 = std::deque<int,_std::allocator<int>_>::operator[]
                                  ((deque<int,_std::allocator<int>_> *)local_90,
                                   _backward_starting_ind);
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_240,(long)*pvVar29);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)&i_6,pvVar25);
            }
            pvVar25 = std::vector<int,_std::allocator<int>_>::back
                                ((vector<int,_std::allocator<int>_> *)&i_6);
            iVar2 = *pvVar25;
            i_7._0_4_ = 0;
            pvVar29 = std::deque<int,_std::allocator<int>_>::back
                                ((deque<int,_std::allocator<int>_> *)local_90);
            iVar3 = *pvVar29;
            pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                      back(pattern_edge_list);
            pvVar18 = std::array<int,_10UL>::operator[](pvVar17,0);
            if (iVar3 == *pvVar18) {
              pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ::back(pattern_edge_list);
              pvVar18 = std::array<int,_10UL>::operator[](pvVar17,0);
              iVar3 = *pvVar18;
              pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        ::back(pattern_edge_list);
              pvVar18 = std::array<int,_10UL>::operator[](pvVar17,1);
              if (*pvVar18 < iVar3) {
                for (uStack_3a0 = 0;
                    sVar16 = std::deque<int,_std::allocator<int>_>::size
                                       ((deque<int,_std::allocator<int>_> *)local_90),
                    uStack_3a0 < sVar16; uStack_3a0 = uStack_3a0 + 1) {
                  pvVar29 = std::deque<int,_std::allocator<int>_>::operator[]
                                      ((deque<int,_std::allocator<int>_> *)local_90,uStack_3a0);
                  iVar3 = *pvVar29;
                  pvVar17 = std::
                            vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                            back(pattern_edge_list);
                  pvVar18 = std::array<int,_10UL>::operator[](pvVar17,1);
                  if (iVar3 == *pvVar18) {
                    i_7._0_4_ = (int)uStack_3a0;
                    break;
                  }
                }
              }
            }
            for (edge_candidates.
                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)i_7;
                sVar16 = std::deque<int,_std::allocator<int>_>::size
                                   ((deque<int,_std::allocator<int>_> *)local_90),
                (ulong)(long)edge_candidates.
                             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < sVar16 - 1;
                edge_candidates.
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     edge_candidates.
                     super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&i_6,
                                   (long)edge_candidates.
                                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              find_backward_edge_candidates
                        ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                         (e_cand._M_elems + 9),
                         (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&adj_edge_info.
                             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                          *)&real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,iVar2,*pvVar25,
                         (vector<int,_std::allocator<int>_> *)local_180,
                         (vector<int,_std::allocator<int>_> *)local_1a0,
                         (vector<int,_std::allocator<int>_> *)local_1c0);
              for (e_cand._M_elems[8] = 0; uVar19 = (ulong)e_cand._M_elems[8],
                  sVar16 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                           ::size((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                   *)(e_cand._M_elems + 9)), uVar19 < sVar16;
                  e_cand._M_elems[8] = e_cand._M_elems[8] + 1) {
                pvVar29 = std::deque<int,_std::allocator<int>_>::back
                                    ((deque<int,_std::allocator<int>_> *)local_90);
                vVar15 = *pvVar29;
                pvVar29 = std::deque<int,_std::allocator<int>_>::operator[]
                                    ((deque<int,_std::allocator<int>_> *)local_90,
                                     (long)edge_candidates.
                                           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
                ;
                vVar4 = *pvVar29;
                this = e_cand._M_elems + 9;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)this,(long)e_cand._M_elems[8]);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,0);
                e_cand._M_elems[0] = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)this,(long)e_cand._M_elems[8]);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,1);
                e_cand._M_elems[1] = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)this,(long)e_cand._M_elems[8]);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,2);
                e_cand._M_elems[2] = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)this,(long)e_cand._M_elems[8]);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,3);
                e_cand._M_elems[3] = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)this,(long)e_cand._M_elems[8]);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,4);
                e_cand._M_elems[4] = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)this,(long)e_cand._M_elems[8]);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,5);
                e_cand._M_elems[5] = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)this,(long)e_cand._M_elems[8]);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,6);
                e_cand._M_elems[6] = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)this,(long)e_cand._M_elems[8]);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,7);
                e_cand._M_elems[7] = *pvVar27;
                children_candidate::children_candidate((children_candidate *)&it);
                cc.elements._M_elems[7] = e_cand._M_elems[7];
                cc.elements._M_elems[6] = e_cand._M_elems[6];
                it._M_node = (_Base_ptr)CONCAT44(vVar4,vVar15);
                cc.elements._M_elems[1] = e_cand._M_elems[1];
                cc.elements._M_elems[0] = e_cand._M_elems[0];
                cc.elements._M_elems[3] = e_cand._M_elems[3];
                cc.elements._M_elems[2] = e_cand._M_elems[2];
                cc.elements._M_elems[5] = e_cand._M_elems[5];
                cc.elements._M_elems[4] = e_cand._M_elems[4];
                local_490._M_node =
                     (_Base_ptr)
                     std::
                     set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                     ::find(__return_storage_ptr__,(children_candidate *)&it);
                local_498._M_node =
                     (_Base_ptr)
                     std::
                     end<std::set<dgrminer::children_candidate,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>>
                               (__return_storage_ptr__);
                bVar14 = std::operator!=(&local_490,&local_498);
                if (bVar14) {
                  pcVar30 = std::_Rb_tree_const_iterator<dgrminer::children_candidate>::operator->
                                      (&local_490);
                  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            (&pcVar30->occurrences,
                             (value_type *)
                             ((long)&adj_list.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                  if ((right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) {
                    pcVar30 = std::_Rb_tree_const_iterator<dgrminer::children_candidate>::operator->
                                        (&local_490);
                    pmVar28 = std::
                              unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                              ::operator[](&pcVar30->multiple_occurrences,
                                           (key_type *)
                                           ((long)&adj_list.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
                    std::
                    set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ::insert(pmVar28,(value_type *)
                                     &antecedent_vertexes._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
                  }
                }
                else {
                  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             (cc.elements._M_elems + 8),
                             (value_type *)
                             ((long)&adj_list.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                  if ((right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) {
                    pmVar28 = std::
                              unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                              ::operator[]((unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                                            *)&cc.occurrences._M_t._M_impl.super__Rb_tree_header.
                                               _M_node_count,
                                           (key_type *)
                                           ((long)&adj_list.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
                    std::
                    set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ::insert(pmVar28,(value_type *)
                                     &antecedent_vertexes._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
                  }
                  std::
                  set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                  ::insert(__return_storage_ptr__,(value_type *)&it);
                }
                children_candidate::~children_candidate((children_candidate *)&it);
              }
              std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
                        ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                         (e_cand._M_elems + 9));
            }
            sVar16 = std::deque<int,_std::allocator<int>_>::size
                               ((deque<int,_std::allocator<int>_> *)local_90);
            real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar16;
            while (real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ =
                        real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ + -1,
                  -1 < real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_) {
              this_00 = &edge_candidates_1.
                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)this_00);
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)&i_6,
                                   (long)real_second_edge_ids.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage._4_4_);
              find_forward_edge_candidates
                        ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                         local_520,
                         (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&adj_edge_info.
                             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                          *)&real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,*pvVar25,
                         (vector<int,_std::allocator<int>_> *)local_240,
                         (vector<int,_std::allocator<int>_> *)this_00);
              for (child_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
                        = 0;
                  uVar19 = (ulong)child_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count._4_4_,
                  sVar16 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                           ::size((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                   *)local_520), uVar19 < sVar16;
                  child_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                       child_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count.
                       _4_4_ + 1) {
                std::set<int,_std::less<int>,_std::allocator<int>_>::set
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_558,
                           (set<int,_std::less<int>,_std::allocator<int>_> *)
                           &antecedent_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count);
                pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)&i_6,
                                     (long)real_second_edge_ids.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_);
                std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_558,pvVar25);
                pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     &edge_candidates_1.
                                      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)child_occurrence_vertexes._M_t._M_impl.
                                           super__Rb_tree_header._M_node_count._4_4_);
                std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_558,pvVar25);
                pvVar29 = std::deque<int,_std::allocator<int>_>::operator[]
                                    ((deque<int,_std::allocator<int>_> *)local_90,
                                     (long)real_second_edge_ids.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_);
                vVar15 = *pvVar29;
                pvVar29 = std::deque<int,_std::allocator<int>_>::back
                                    ((deque<int,_std::allocator<int>_> *)local_90);
                iVar2 = *pvVar29;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)local_520,
                                       (long)child_occurrence_vertexes._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count._4_4_);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,0);
                vVar5 = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)local_520,
                                       (long)child_occurrence_vertexes._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count._4_4_);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,1);
                vVar6 = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)local_520,
                                       (long)child_occurrence_vertexes._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count._4_4_);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,2);
                vVar7 = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)local_520,
                                       (long)child_occurrence_vertexes._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count._4_4_);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,3);
                vVar8 = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)local_520,
                                       (long)child_occurrence_vertexes._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count._4_4_);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,4);
                vVar9 = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)local_520,
                                       (long)child_occurrence_vertexes._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count._4_4_);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,5);
                vVar10 = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)local_520,
                                       (long)child_occurrence_vertexes._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count._4_4_);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,6);
                vVar11 = *pvVar27;
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[]((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        *)local_520,
                                       (long)child_occurrence_vertexes._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count._4_4_);
                pvVar27 = std::array<int,_8UL>::operator[](pvVar24,7);
                vVar12 = *pvVar27;
                children_candidate::children_candidate((children_candidate *)&it_1);
                cc_1.elements._M_elems[7] = vVar12;
                cc_1.elements._M_elems[6] = vVar11;
                it_1._M_node = (_Base_ptr)CONCAT44(iVar2 + 1,vVar15);
                cc_1.elements._M_elems[1] = vVar6;
                cc_1.elements._M_elems[0] = vVar5;
                cc_1.elements._M_elems[3] = vVar8;
                cc_1.elements._M_elems[2] = vVar7;
                cc_1.elements._M_elems[5] = vVar10;
                cc_1.elements._M_elems[4] = vVar9;
                local_640._M_node =
                     (_Base_ptr)
                     std::
                     set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                     ::find(__return_storage_ptr__,(children_candidate *)&it_1);
                local_648._M_node =
                     (_Base_ptr)
                     std::
                     end<std::set<dgrminer::children_candidate,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>>
                               (__return_storage_ptr__);
                bVar14 = std::operator!=(&local_640,&local_648);
                if (bVar14) {
                  pcVar30 = std::_Rb_tree_const_iterator<dgrminer::children_candidate>::operator->
                                      (&local_640);
                  pVar33 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                     (&pcVar30->occurrences,
                                      (value_type *)
                                      ((long)&adj_list.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      ));
                  local_658 = (_Base_ptr)pVar33.first._M_node;
                  local_650 = pVar33.second;
                  if ((right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) {
                    pcVar30 = std::_Rb_tree_const_iterator<dgrminer::children_candidate>::operator->
                                        (&local_640);
                    pmVar28 = std::
                              unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                              ::operator[](&pcVar30->multiple_occurrences,
                                           (key_type *)
                                           ((long)&adj_list.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
                    pVar32 = std::
                             set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             ::insert(pmVar28,(value_type *)local_558);
                    local_668 = (_Base_ptr)pVar32.first._M_node;
                    local_660 = pVar32.second;
                  }
                }
                else {
                  pVar33 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                      (cc_1.elements._M_elems + 8),
                                      (value_type *)
                                      ((long)&adj_list.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      ));
                  local_678 = (_Base_ptr)pVar33.first._M_node;
                  local_670 = pVar33.second;
                  if ((right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) {
                    pmVar28 = std::
                              unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                              ::operator[]((unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                                            *)&cc_1.occurrences._M_t._M_impl.super__Rb_tree_header.
                                               _M_node_count,
                                           (key_type *)
                                           ((long)&adj_list.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
                    pVar32 = std::
                             set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             ::insert(pmVar28,(value_type *)local_558);
                    local_688 = (_Base_ptr)pVar32.first._M_node;
                    local_680 = pVar32.second;
                  }
                  pVar34 = std::
                           set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                           ::insert(__return_storage_ptr__,(value_type *)&it_1);
                  _j = pVar34.first._M_node;
                  local_690 = pVar34.second;
                }
                children_candidate::~children_candidate((children_candidate *)&it_1);
                std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_558);
              }
              std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
                        ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                         local_520);
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)
                         &edge_candidates_1.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            sVar16 = std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)local_180);
            if ((ulong)(long)u._4_4_ < sVar16) {
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_180,(long)u._4_4_);
              *pvVar25 = 0;
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1a0,(long)u._4_4_);
              *pvVar25 = 0;
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1c0,(long)u._4_4_);
              *pvVar25 = 0;
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_1e0,(long)u._4_4_);
              *pvVar25 = 0;
            }
            u._4_4_ = u._4_4_ + -1;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)&i_6);
            std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       &antecedent_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          if (u._4_4_ != 0) {
            pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                      operator[](pattern_edge_list,(long)u._4_4_);
            pvVar18 = std::array<int,_10UL>::operator[](pvVar17,0);
            src = *pvVar18;
            pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                      operator[](pattern_edge_list,(long)u._4_4_);
            pvVar18 = std::array<int,_10UL>::operator[](pvVar17,1);
            dst = *pvVar18;
            if (src <= dst) {
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_240,(long)src);
              edge_ind_1._4_4_ = *pvVar25;
              edge_ind_1._3_1_ = 1;
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_260,(long)u._4_4_);
              uStack_700 = (ulong)*pvVar25;
              while( true ) {
                uVar19 = uStack_700;
                pvVar22 = std::
                          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        *)&adj_edge_info.
                                           super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (long)edge_ind_1._4_4_);
                sVar16 = std::vector<int,_std::allocator<int>_>::size(pvVar22);
                if (sVar16 <= uVar19) break;
                pvVar23 = std::
                          vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                          ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                        *)&real_ids_src.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage,
                                       (long)edge_ind_1._4_4_);
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[](pvVar23,uStack_700);
                pvVar17 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](pattern_edge_list,(long)u._4_4_);
                bVar14 = is_adj_info_equal_to_pattern_edge(pvVar24,pvVar17,true);
                if (bVar14) {
                  pvVar22 = std::
                            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          *)&adj_edge_info.
                                             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (long)edge_ind_1._4_4_);
                  pvVar25 = std::vector<int,_std::allocator<int>_>::operator[](pvVar22,uStack_700);
                  k_1._4_4_ = *pvVar25;
                  k_1._3_1_ = 0;
                  for (i_11 = 0; sVar13 = i_11,
                      sVar16 = std::vector<int,_std::allocator<int>_>::size
                                         ((vector<int,_std::allocator<int>_> *)local_180),
                      sVar13 < sVar16; i_11 = i_11 + 1) {
                    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_180,i_11);
                    bVar14 = false;
                    if (*pvVar25 == edge_ind_1._4_4_) {
                      pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)local_1a0,i_11);
                      bVar14 = false;
                      if (*pvVar25 == k_1._4_4_) {
                        pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)local_1c0,i_11);
                        bVar14 = (long)*pvVar25 == uStack_700;
                      }
                    }
                    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_180,i_11);
                    bVar31 = false;
                    if (*pvVar25 == k_1._4_4_) {
                      pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)local_1a0,i_11);
                      bVar31 = false;
                      if (*pvVar25 == edge_ind_1._4_4_) {
                        pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)local_1e0,i_11);
                        bVar31 = (long)*pvVar25 == uStack_700;
                      }
                    }
                    if (bVar14 || bVar31) {
                      k_1._3_1_ = 1;
                      break;
                    }
                  }
                  vVar15 = edge_ind_1._4_4_;
                  if ((k_1._3_1_ & 1) == 0) {
                    edge_ind_1._3_1_ = 0;
                    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_180,
                                         (long)u._4_4_);
                    vVar4 = k_1._4_4_;
                    *pvVar25 = vVar15;
                    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_1a0,
                                         (long)u._4_4_);
                    *pvVar25 = vVar4;
                    vVar15 = (value_type)uStack_700;
                    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_1c0,
                                         (long)u._4_4_);
                    *pvVar25 = vVar15;
                    local_718 = 0;
                    goto LAB_00189a62;
                  }
                }
                uStack_700 = uStack_700 + 1;
              }
              goto LAB_00189c0d;
            }
            pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_240,(long)src);
            vStack_6a4 = *pvVar25;
            pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_240,(long)dst);
            local_6a8 = *pvVar25;
            edge_ind._7_1_ = 1;
            pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_260,(long)u._4_4_);
            uStack_6b8 = (ulong)*pvVar25;
            while( true ) {
              uVar19 = uStack_6b8;
              pvVar22 = std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      *)&adj_edge_info.
                                         super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)vStack_6a4);
              sVar16 = std::vector<int,_std::allocator<int>_>::size(pvVar22);
              if (sVar16 <= uVar19) break;
              pvVar22 = std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      *)&adj_edge_info.
                                         super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)vStack_6a4);
              pvVar25 = std::vector<int,_std::allocator<int>_>::operator[](pvVar22,uStack_6b8);
              if (*pvVar25 == local_6a8) {
                pvVar23 = std::
                          vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                          ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                        *)&real_ids_src.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage,
                                       (long)vStack_6a4);
                pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ::operator[](pvVar23,uStack_6b8);
                pvVar17 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](pattern_edge_list,(long)u._4_4_);
                bVar14 = is_adj_info_equal_to_pattern_edge(pvVar24,pvVar17,true);
                if (bVar14) {
                  k._7_1_ = 0;
                  for (i_10 = 0; sVar13 = i_10,
                      sVar16 = std::vector<int,_std::allocator<int>_>::size
                                         ((vector<int,_std::allocator<int>_> *)local_180),
                      sVar13 < sVar16; i_10 = i_10 + 1) {
                    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_180,i_10);
                    bVar14 = false;
                    if (*pvVar25 == vStack_6a4) {
                      pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)local_1a0,i_10);
                      bVar14 = false;
                      if (*pvVar25 == local_6a8) {
                        pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)local_1c0,i_10);
                        bVar14 = (long)*pvVar25 == uStack_6b8;
                      }
                    }
                    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_180,i_10);
                    bVar31 = false;
                    if (*pvVar25 == local_6a8) {
                      pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                          ((vector<int,_std::allocator<int>_> *)local_1a0,i_10);
                      bVar31 = false;
                      if (*pvVar25 == vStack_6a4) {
                        pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)local_1e0,i_10);
                        bVar31 = (long)*pvVar25 == uStack_6b8;
                      }
                    }
                    if (bVar14 || bVar31) {
                      k._7_1_ = 1;
                      break;
                    }
                  }
                  vVar15 = vStack_6a4;
                  if ((k._7_1_ & 1) == 0) {
                    edge_ind._7_1_ = 0;
                    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_180,
                                         (long)u._4_4_);
                    vVar4 = local_6a8;
                    *pvVar25 = vVar15;
                    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_1a0,
                                         (long)u._4_4_);
                    *pvVar25 = vVar4;
                    vVar15 = (value_type)uStack_6b8;
                    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_1c0,
                                         (long)u._4_4_);
                    *pvVar25 = vVar15;
                    local_6d0 = 0;
                    goto LAB_00189537;
                  }
                }
              }
              uStack_6b8 = uStack_6b8 + 1;
            }
            goto LAB_001896bb;
          }
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)local_260);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)local_240);
        }
        i_2 = i_2 + 1;
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1e0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1c0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1a0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_180);
    std::
    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ::~vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               *)&real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&adj_edge_info.
                  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  } while( true );
LAB_00189a62:
  uVar19 = local_718;
  pvVar22 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&adj_edge_info.
                             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k_1._4_4_);
  sVar16 = std::vector<int,_std::allocator<int>_>::size(pvVar22);
  if (sVar16 <= uVar19) goto LAB_00189b8e;
  pvVar22 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&adj_edge_info.
                             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k_1._4_4_);
  pvVar25 = std::vector<int,_std::allocator<int>_>::operator[](pvVar22,local_718);
  local_b11 = false;
  if (*pvVar25 == edge_ind_1._4_4_) {
    pvVar23 = std::
              vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
              ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                            *)&real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)k_1._4_4_);
    pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                        (pvVar23,local_718);
    flipAdjacencyInfo(&local_738,pvVar24);
    pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](pattern_edge_list,(long)u._4_4_);
    local_b11 = is_adj_info_equal_to_pattern_edge(&local_738,pvVar17,true);
  }
  if (local_b11 != false) {
    vVar15 = (value_type)local_718;
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_1e0,(long)u._4_4_);
    *pvVar25 = vVar15;
    goto LAB_00189b8e;
  }
  local_718 = local_718 + 1;
  goto LAB_00189a62;
LAB_00189b8e:
  vVar15 = k_1._4_4_;
  pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_240,(long)dst);
  *pvVar25 = vVar15;
  iVar2 = (int)uStack_700;
  pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_260,(long)u._4_4_);
  *pvVar25 = iVar2 + 1;
  u._4_4_ = u._4_4_ + 1;
LAB_00189c0d:
  if ((edge_ind_1._3_1_ & 1) != 0) {
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_260,(long)u._4_4_);
    *pvVar25 = 0;
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_180,(long)u._4_4_);
    *pvVar25 = 0;
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_1a0,(long)u._4_4_);
    *pvVar25 = 0;
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_1c0,(long)u._4_4_);
    *pvVar25 = 0;
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_1e0,(long)u._4_4_);
    *pvVar25 = 0;
    u._4_4_ = u._4_4_ + -1;
  }
  goto LAB_00187f22;
LAB_00189537:
  uVar19 = local_6d0;
  pvVar22 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&adj_edge_info.
                             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_6a8);
  sVar16 = std::vector<int,_std::allocator<int>_>::size(pvVar22);
  if (sVar16 <= uVar19) goto LAB_00189663;
  pvVar22 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&adj_edge_info.
                             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_6a8);
  pvVar25 = std::vector<int,_std::allocator<int>_>::operator[](pvVar22,local_6d0);
  local_ac1 = false;
  if (*pvVar25 == vStack_6a4) {
    pvVar23 = std::
              vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
              ::operator[]((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                            *)&real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)local_6a8);
    pvVar24 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                        (pvVar23,local_6d0);
    flipAdjacencyInfo((array<int,_8UL> *)local_6f0,pvVar24);
    pvVar17 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](pattern_edge_list,(long)u._4_4_);
    local_ac1 = is_adj_info_equal_to_pattern_edge((array<int,_8UL> *)local_6f0,pvVar17,true);
  }
  if (local_ac1 != false) {
    vVar15 = (value_type)local_6d0;
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_1e0,(long)u._4_4_);
    *pvVar25 = vVar15;
    goto LAB_00189663;
  }
  local_6d0 = local_6d0 + 1;
  goto LAB_00189537;
LAB_00189663:
  iVar2 = (int)uStack_6b8;
  pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_260,(long)u._4_4_);
  *pvVar25 = iVar2 + 1;
  u._4_4_ = u._4_4_ + 1;
LAB_001896bb:
  if ((edge_ind._7_1_ & 1) != 0) {
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_260,(long)u._4_4_);
    *pvVar25 = 0;
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_180,(long)u._4_4_);
    *pvVar25 = 0;
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_1a0,(long)u._4_4_);
    *pvVar25 = 0;
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_1c0,(long)u._4_4_);
    *pvVar25 = 0;
    pvVar25 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_1e0,(long)u._4_4_);
    *pvVar25 = 0;
    u._4_4_ = u._4_4_ + -1;
  }
  goto LAB_00187f22;
}

Assistant:

std::set<children_candidate> enumerate(std::vector<AdjacencyListCrate> &adjacency_lists, std::vector<int> &graph_ids,
                                           std::vector<std::array<int, PAT___SIZE>> &pattern_edge_list,
                                           std::vector<std::set<int>> &nodes_occupied_by_antecedent,
                                           std::vector<std::set<int>> &edges_occupied_by_antecedent, bool new_measures,
										   std::unordered_map<int, std::set<std::set<int>>> &multiple_pattern_occurrences,
										   std::unordered_map<int, std::set<std::set<int>>> &multiple_antecedent_occurrences)
	{
        // this functions is used for finding children candidates (return value)
        // adjacency_lists - adjacency list for each graph
        // graph_ids - ids of snapshots with the pattern
        // pattern_edge_list - pattern whose children are to be searched for
        // nodes_occupied_by_antecedent - (output parameter)
        // edges_occupied_by_antecedent - (output parameter)

        // here will be the result:
		std::set<children_candidate> children_candidates;

        // right-most path used for candidate generation (similarly as in gSpan)
		std::deque<int> right_most_path = find_rightmost_path(pattern_edge_list);

		// use maximum node id as a limit of number of nodes (used later)
		int number_of_nodes_in_pattern_edge_list = 0;
		for (size_t i = 0; i < pattern_edge_list.size(); i++) {
			if (number_of_nodes_in_pattern_edge_list < pattern_edge_list[i][1]) number_of_nodes_in_pattern_edge_list = pattern_edge_list[i][1];
		}
		number_of_nodes_in_pattern_edge_list++;

		// initialize nodes_occupied_by_antecedent and edges_occupied_by_antecedent vectors
		for (int i = 0; i < adjacency_lists.size(); i++) {
			nodes_occupied_by_antecedent.push_back(std::set<int>());
			edges_occupied_by_antecedent.push_back(std::set<int>());
		}

		// find occurrences in each graph
		for (int g_id : graph_ids)
		{
            // get the adjacency list (and also edge info) for the graph currently being processed
			std::vector<std::vector<int>> adj_list = adjacency_lists[g_id].adjacencyList;
			std::vector<std::vector<std::array<int, 8>>> adj_edge_info = adjacency_lists[g_id].adjacencyEdgeInfo;

			// these two vectors save src and dst vertices (their IDs) which correspond to real occurrences of the src and dst vertices of the pattern
            // i.e. it is mapping from pattern vertex ids to vertex ids in adjacency list
			std::vector<int> real_ids_src(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_dst(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_dst_ind(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_src_ind(pattern_edge_list.size(), 0);


			int index_in_pattern_edge_list = 0;  // which element of pattern_edge_list are we currently processing

			// find occurrences in the current adj_list
            // begin by going through all edges in the adjacency list of the current graph:
			for (size_t u = 0; u < adj_list.size(); u++)
			{
				for (size_t v = 0; v < adj_list[u].size(); v++)
				{
                    // check whether the current edge in the adjacency list is equal to the current edge pattern:
					if (is_adj_info_equal_to_pattern_edge(adj_edge_info[u][v], pattern_edge_list[index_in_pattern_edge_list], true)) {
						// we found the first edge from pattern_edge_list in the adjacency list

						// which SRC and DST vertex ids (form adjacency list) were used:
						real_ids_src[0] = u;
						real_ids_dst[0] = adj_list[u][v];
                        // under which index can we find DST in the list edges going from SRC:
						real_ids_dst_ind[0] = v;
                        // and also the opposite information (under which index can we find SRC in the list of edges going from DST):
						for (size_t i = 0; i < adj_list[real_ids_dst[0]].size(); i++)
						{
							if (adj_list[real_ids_dst[0]][i] == u && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[real_ids_dst[0]][i]), pattern_edge_list[index_in_pattern_edge_list], true))
							{
								real_ids_src_ind[0] = i;
								break;
							}
						}

						// initialize the helping variables and vectors
						// here we have the real IDs of vertices 0, 1, 2, ... from the pattern (i.e. mapping of pattern vertex ID i to real vertex ID in adjacency list can be found under index i)
						std::vector<int> sequence_of_nodes(number_of_nodes_in_pattern_edge_list, 0);
						// first edge is always forward from 0 to 1:
						sequence_of_nodes[0] = u;
						sequence_of_nodes[1] = adj_list[u][v];

                        // for each edge from pattern_edge_list, we store the index of lastly processed neighbor of the relevant node (i.e. index in adj_list[src])
						// it is used for backtracking: if we backtrack we continue from that index and not from zero.
						std::vector<int> sequence_of_edge_indices(pattern_edge_list.size(), 0);
						sequence_of_edge_indices[index_in_pattern_edge_list] = v;
						index_in_pattern_edge_list++;

						// do depth first search
						while (true) {
							// if we found the occurrence of the whole pattern:
							if (index_in_pattern_edge_list >= pattern_edge_list.size())
							{
								// save antecedent nodes and edges (i.e. those that are not addition changes) to edges_occupied_by_antecedent and edges_occupied_by_antecedent
								// (used for anomalies)
								for (int i = 0; i < pattern_edge_list.size(); i++) {
									int n_1 = real_ids_src[i];
									int n_2 = real_ids_dst_ind[i];

									// all elements of the frequent pattern should be occupied
									nodes_occupied_by_antecedent[g_id].insert(n_1);
									nodes_occupied_by_antecedent[g_id].insert(real_ids_dst[i]);
									edges_occupied_by_antecedent[g_id].insert(adj_edge_info[n_1][n_2][ADJ_INFO_ID]);
								}

							  	std::set<int> pattern_occurrence_vertexes;

							  	// save pattern occurrence and antecedent occurrence in order to properly calculate new measures
							  	if (new_measures) {
								  	std::set<int> antecedent_vertexes;
								  	for (int i = 0; i < pattern_edge_list.size(); ++i) {
									  	int n_1 = real_ids_src[i];

									  	pattern_occurrence_vertexes.insert(n_1);
									  	pattern_occurrence_vertexes.insert(real_ids_dst[i]);

									  	if (pattern_edge_list[i][PAT_SRC_CHANGETIME] != 0) {
											antecedent_vertexes.insert(n_1);
										}

									  	if (pattern_edge_list[i][PAT_DST_CHANGETIME] != 0) {
											antecedent_vertexes.insert(real_ids_dst[i]);
										}
									}

								  	multiple_pattern_occurrences[g_id].insert(pattern_occurrence_vertexes);
								  	multiple_antecedent_occurrences[g_id].insert(antecedent_vertexes);
								}

								std::vector<int> right_most_path_occurrence;
								for (size_t i = 0; i < right_most_path.size(); i++)
								{
									right_most_path_occurrence.push_back(sequence_of_nodes[right_most_path[i]]);
								}

								// generate all children (i.e. generate all edges which can be appended to the base pattern(pattern_edge_list)) and their occurrence

								// first, generate the backward edges (candidates):
								int right_most_vertex = right_most_path_occurrence.back();

								int backward_starting_ind = 0;
								if (right_most_path.back() == pattern_edge_list.back()[PAT_SRC_ID] && pattern_edge_list.back()[PAT_SRC_ID] > pattern_edge_list.back()[PAT_DST_ID])
								{
									// if the last edge in edge_list is a backward edge from the current RMP, add only edges with greater code
									for (size_t i = 0; i < right_most_path.size(); i++)
									{
										if (right_most_path[i] == pattern_edge_list.back()[PAT_DST_ID])
										{
											backward_starting_ind = i;
											break;
										}
									}
								}

								for (int i = backward_starting_ind; i < right_most_path.size() - 1; i++)
								{
									std::vector<std::array<int, 8>> edge_candidates = find_backward_edge_candidates(adj_list, adj_edge_info,
										right_most_vertex, right_most_path_occurrence[i],
										real_ids_src, real_ids_dst, real_ids_dst_ind);

									// save the edge_candidates (i,j must be appended)
									for (int j = 0; j < edge_candidates.size(); j++)
									{
										// save all children candidates
										std::array<int, 10> e_cand = { right_most_path.back(), right_most_path[i],
											edge_candidates[j][0], edge_candidates[j][1], edge_candidates[j][2], edge_candidates[j][3], edge_candidates[j][4],
											edge_candidates[j][5], edge_candidates[j][6], edge_candidates[j][7] };

										children_candidate cc;
										cc.elements = e_cand;
										// does not use edge ID when searching for the edge (we care only about the edge itself and its graph ids = occurrences)
										auto it = children_candidates.find(cc);

										if (it != std::end(children_candidates))
										{
											(it->occurrences).insert(g_id);

											if (new_measures) {
											  	it->multiple_occurrences[g_id].insert(pattern_occurrence_vertexes);
											}
										}
										else {
											cc.occurrences.insert(g_id);

											if (new_measures) {
											  	cc.multiple_occurrences[g_id].insert(pattern_occurrence_vertexes);
											}

										  	children_candidates.insert(cc);
										}
									}
								}

								// forward candidates:
								for (int i = right_most_path.size() - 1; i >= 0; i--)
								{
								  	std::vector<int> real_second_edge_ids;
								  	// realne id1 right_most_path_occurrence[i]
									std::vector<std::array<int, 8>> edge_candidates = find_forward_edge_candidates(adj_list, adj_edge_info,
										right_most_path_occurrence[i], sequence_of_nodes, real_second_edge_ids);

									for (int j = 0; j < edge_candidates.size(); j++)
									{
									  	std::set<int> child_occurrence_vertexes = pattern_occurrence_vertexes;
									  	child_occurrence_vertexes.insert(right_most_path_occurrence[i]);
									  	child_occurrence_vertexes.insert(real_second_edge_ids[j]);

										std::array<int, 10> e_cand = { right_most_path[i], right_most_path.back() + 1,
											edge_candidates[j][0], edge_candidates[j][1], edge_candidates[j][2], edge_candidates[j][3], edge_candidates[j][4],
											edge_candidates[j][5], edge_candidates[j][6], edge_candidates[j][7] };


										children_candidate cc;
										cc.elements = e_cand;
										// does not use edge ID when searching for the edge (we care only about the edge itself and its graph ids = occurrences)
										auto it = children_candidates.find(cc);


										if (it != std::end(children_candidates))
										{
											(it->occurrences).insert(g_id);

											if (new_measures) {
											  	it->multiple_occurrences[g_id].insert(child_occurrence_vertexes);
											}
										}
										else
										{
											cc.occurrences.insert(g_id);

										  	if (new_measures) {
												cc.multiple_occurrences[g_id].insert(child_occurrence_vertexes);
											}

											children_candidates.insert(cc);
										}
									}
								}

								// and backtrack
								if (index_in_pattern_edge_list < real_ids_src.size())
								{
									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;

								}
								index_in_pattern_edge_list--;

							} // if (current_index_in_edge_list >= pattern_edge_list.size()) // (if we found the occurrence of the whole pattern)

							// if we backtracked down to 1, it means that we tried all possibilities from this starting point in the given adjacency list
							if (index_in_pattern_edge_list == 0)
							{
								break;
							}

							// traverse (i.e. try to match the rest of the pattern with respect to the selected starting position in adjacency list):
							// try to find the occurrence of this pattern edge:
							int i = pattern_edge_list[index_in_pattern_edge_list][0];
							int j = pattern_edge_list[index_in_pattern_edge_list][1];

                            // check whether the edge is forward or backward
							if (i > j)
							{
								// backward edge;
								// we already have both vertices (real ids from adjacency list) in sequence_of_nodes, so get them:
								int src = sequence_of_nodes[i];
								int dst = sequence_of_nodes[j];
								// find the first index of an edge from "src" to "dst" and save the index into sequence_of_edge_indices
								bool should_backtrack = true;
								for (size_t edge_ind = sequence_of_edge_indices[index_in_pattern_edge_list]; edge_ind < adj_list[src].size(); edge_ind++)
								{
									// if we found the appropriate edge (don't use edge ID for matching):
									if (adj_list[src][edge_ind] == dst && is_adj_info_equal_to_pattern_edge(adj_edge_info[src][edge_ind], pattern_edge_list[index_in_pattern_edge_list], true))
									{
										// there can be only one edge which exactly matches
										// check if that edge is already there (occupied by traversal):
										bool is_already_there = false;
										for (size_t k = 0; k < real_ids_src.size(); k++)
										{
											if ((real_ids_src[k] == src && real_ids_dst[k] == dst && real_ids_dst_ind[k] == edge_ind)
												| (real_ids_src[k] == dst && real_ids_dst[k] == src && real_ids_src_ind[k] == edge_ind))
											{
												is_already_there = true;
												break;
											}
										}

										if (!is_already_there)
										{
											should_backtrack = false;
                                            // store the positions
											real_ids_src[index_in_pattern_edge_list] = src;
											real_ids_dst[index_in_pattern_edge_list] = dst;
											real_ids_dst_ind[index_in_pattern_edge_list] = edge_ind;
											for (size_t i = 0; i < adj_list[dst].size(); i++)
											{
												if (adj_list[dst][i] == src && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[dst][i]), pattern_edge_list[index_in_pattern_edge_list], true))
												{
													real_ids_src_ind[index_in_pattern_edge_list] = i;
													break;
												}
											}

											sequence_of_edge_indices[index_in_pattern_edge_list] = edge_ind + 1;
											index_in_pattern_edge_list++;

											break;
										}

									}
								}

								if (should_backtrack)
								{

									sequence_of_edge_indices[index_in_pattern_edge_list] = 0;



									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;

									index_in_pattern_edge_list--;
								}
							}
							else
							{
								// forward edge
								// "src" vertex is already known in this case
								int src = sequence_of_nodes[i];
								// (but we must find the appropriate "dst" vertex)
								bool should_backtrack = true;
								for (size_t edge_ind = sequence_of_edge_indices[index_in_pattern_edge_list]; edge_ind < adj_list[src].size(); edge_ind++)
								{
									if (is_adj_info_equal_to_pattern_edge(adj_edge_info[src][edge_ind], pattern_edge_list[index_in_pattern_edge_list], true))
									{
										int dst = adj_list[src][edge_ind];
										// check if that edge is already there:
										bool is_already_there = false;
										for (size_t k = 0; k < real_ids_src.size(); k++)
										{
											if ((real_ids_src[k] == src && real_ids_dst[k] == dst && real_ids_dst_ind[k] == edge_ind)
												| (real_ids_src[k] == dst && real_ids_dst[k] == src && real_ids_src_ind[k] == edge_ind))
											{
												is_already_there = true;
												break;
											}
										}
										if (!is_already_there)
										{
											should_backtrack = false;
											real_ids_src[index_in_pattern_edge_list] = src;
											real_ids_dst[index_in_pattern_edge_list] = dst;
											real_ids_dst_ind[index_in_pattern_edge_list] = edge_ind;

											for (size_t i = 0; i < adj_list[dst].size(); i++)
											{
												if (adj_list[dst][i] == src && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[dst][i]), pattern_edge_list[index_in_pattern_edge_list], true))
												{
													real_ids_src_ind[index_in_pattern_edge_list] = i;
													break;
												}
											}

											sequence_of_nodes[j] = dst;
											sequence_of_edge_indices[index_in_pattern_edge_list] = edge_ind + 1;
											index_in_pattern_edge_list++;

											break;
										}
									}

								}

								if (should_backtrack)
								{
									sequence_of_edge_indices[index_in_pattern_edge_list] = 0;
									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;
									index_in_pattern_edge_list--;
								}
							}

						}

					} // if (is_adj_info_equal_to_pattern_edge(adj_edge_info[u][v], pattern_edge_list[current_index_in_edge_list], true))

				} // for (size_t v = 0; v < adj_list[u].size(); v++)
			} // for (size_t u = 0; u < adj_list.size(); u++)

		} // for (int g_id : graph_ids)

		return children_candidates;
	}